

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_2dPoint ON_LiftInverse(ON_2dPoint P,ON_Interval *dom,bool *closed)

{
  ON_2dPoint OVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int local_3c;
  int di;
  bool *closed_local;
  ON_Interval *dom_local;
  ON_2dPoint P_local;
  ON_2dPoint Q;
  
  P_local.y = P.x;
  if (((*closed & 1U) != 0) || ((closed[1] & 1U) != 0)) {
    P_local.x = P.y;
    for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
      if ((closed[local_3c] & 1U) != 0) {
        pdVar2 = ON_2dPoint::operator[]((ON_2dPoint *)&P_local.y,local_3c);
        dVar4 = *pdVar2;
        pdVar2 = ON_Interval::operator[](dom + local_3c,0);
        dVar5 = *pdVar2;
        dVar3 = ON_Interval::Length(dom + local_3c);
        dVar4 = floor((dVar4 - dVar5) / dVar3);
        dVar5 = ON_Interval::Length(dom + local_3c);
        pdVar2 = ON_2dPoint::operator[]((ON_2dPoint *)&P_local.y,local_3c);
        *pdVar2 = -dVar4 * dVar5 + *pdVar2;
      }
    }
  }
  OVar1.y = P.y;
  OVar1.x = P_local.y;
  return OVar1;
}

Assistant:

ON_2dPoint ON_LiftInverse(ON_2dPoint P, ON_Interval dom[2], bool closed[2])
{
	ON_2dPoint Q = P;
	if (closed[0] || closed[1])
	{
		for (int di = 0; di < 2; di++)
		{
			if (closed[di])
				Q[di] -= floor((Q[di] - dom[di][0]) / dom[di].Length())*dom[di].Length();

		}
	}
	return Q;
}